

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O1

int is_vdso(link_map *map)

{
  link_map *plVar1;
  bool bVar2;
  
  if (map == (link_map *)0x0) {
    bVar2 = false;
  }
  else {
    plVar1 = is_vdso::vdso;
    if (is_vdso_vdso_checked != '\x01') {
      is_vdso_vdso_checked = '\x01';
      plVar1 = get_vdso_from_aliases();
      if (((plVar1 == (link_map *)0x0) && (plVar1 = get_vdso_from_auxv(), plVar1 == (link_map *)0x0)
          ) && (plVar1 = get_vdso_from_maps(), plVar1 == (link_map *)0x0)) {
        bVar2 = false;
        goto LAB_00223714;
      }
    }
    is_vdso::vdso = plVar1;
    bVar2 = is_vdso::vdso == map;
  }
LAB_00223714:
  return (int)bVar2;
}

Assistant:

int is_vdso(const struct link_map *map) {
  static int vdso_checked = 0;
  static struct link_map *vdso = NULL;
  struct link_map *result = NULL;

  if (!map) return 0;
  if (vdso_checked) return (map == vdso);

  vdso_checked = 1;

  result = get_vdso_from_aliases();
  if (result) {
    vdso = result;         // GCOVR_EXCL_LINE
    return (map == vdso);  // GCOVR_EXCL_LINE
  }

  result = get_vdso_from_auxv();
  if (result) {
    vdso = result;
    return (map == vdso);
  }

  result = get_vdso_from_maps();  // GCOVR_EXCL_START
  if (result) {
    vdso = result;
    return (map == vdso);
  }

  return 0;
}